

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPSolver.cpp
# Opt level: O0

void __thiscall MDPSolver::LoadQTable(MDPSolver *this,string *filename,QTable *Q)

{
  PlanningUnitMADPDiscrete *in_RDI;
  QTable *in_stack_00000408;
  size_t in_stack_00000410;
  size_t in_stack_00000418;
  string *in_stack_00000420;
  
  GetPU((MDPSolver *)in_RDI);
  PlanningUnitMADPDiscrete::GetNrStates(in_RDI);
  GetPU((MDPSolver *)in_RDI);
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x86f1bb);
  QTable::Load(in_stack_00000420,in_stack_00000418,in_stack_00000410,in_stack_00000408);
  return;
}

Assistant:

void MDPSolver::LoadQTable(const string &filename,
                           QTable &Q)
{
    QTable::Load(filename,
                 GetPU()->GetNrStates(),
                 GetPU()->GetNrJointActions(),
                 Q);
}